

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress.c
# Opt level: O0

int compress2(Bytef *dest,uLongf *destLen,Bytef *source,uLong sourceLen,int level)

{
  int flush;
  int local_c4;
  uint local_c0;
  uint local_bc;
  ulong local_b8;
  uLong left;
  uInt max;
  int err;
  z_stream stream;
  uLong uStack_30;
  int level_local;
  uLong sourceLen_local;
  Bytef *source_local;
  uLongf *destLen_local;
  Bytef *dest_local;
  
  local_b8 = *destLen;
  *destLen = 0;
  stream.state = (internal_state *)0x0;
  stream.zalloc = (alloc_func)0x0;
  stream.zfree = (free_func)0x0;
  stream.reserved._4_4_ = level;
  dest_local._4_4_ = deflateInit_((z_streamp)&max,level,"1.3.1",0x70);
  if (dest_local._4_4_ == 0) {
    stream.next_out._0_4_ = 0;
    stream.next_in._0_4_ = 0;
    _max = source;
    stream.total_in = (uLong)dest;
    uStack_30 = sourceLen;
    do {
      if ((uint)stream.next_out == 0) {
        if (local_b8 < 0x100000000) {
          local_bc = (uint)local_b8;
        }
        else {
          local_bc = 0xffffffff;
        }
        stream.next_out._0_4_ = local_bc;
        local_b8 = local_b8 - local_bc;
      }
      if ((uint)stream.next_in == 0) {
        if (uStack_30 < 0x100000000) {
          local_c0 = (uint)uStack_30;
        }
        else {
          local_c0 = 0xffffffff;
        }
        stream.next_in._0_4_ = local_c0;
        uStack_30 = uStack_30 - local_c0;
      }
      flush = 4;
      if (uStack_30 != 0) {
        flush = 0;
      }
      local_c4 = deflate((z_streamp)&max,flush);
    } while (local_c4 == 0);
    *destLen = stream._32_8_;
    deflateEnd((z_streamp)&max);
    if (local_c4 == 1) {
      local_c4 = 0;
    }
    dest_local._4_4_ = local_c4;
  }
  return dest_local._4_4_;
}

Assistant:

int ZEXPORT compress2(Bytef *dest, uLongf *destLen, const Bytef *source,
                      uLong sourceLen, int level) {
    z_stream stream;
    int err;
    const uInt max = (uInt)-1;
    uLong left;

    left = *destLen;
    *destLen = 0;

    stream.zalloc = (alloc_func)0;
    stream.zfree = (free_func)0;
    stream.opaque = (voidpf)0;

    err = deflateInit(&stream, level);
    if (err != Z_OK) return err;

    stream.next_out = dest;
    stream.avail_out = 0;
    stream.next_in = (z_const Bytef *)source;
    stream.avail_in = 0;

    do {
        if (stream.avail_out == 0) {
            stream.avail_out = left > (uLong)max ? max : (uInt)left;
            left -= stream.avail_out;
        }
        if (stream.avail_in == 0) {
            stream.avail_in = sourceLen > (uLong)max ? max : (uInt)sourceLen;
            sourceLen -= stream.avail_in;
        }
        err = deflate(&stream, sourceLen ? Z_NO_FLUSH : Z_FINISH);
    } while (err == Z_OK);

    *destLen = stream.total_out;
    deflateEnd(&stream);
    return err == Z_STREAM_END ? Z_OK : err;
}